

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::FloatingPointLE<double>
          (internal *this,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  AssertionResult *pAVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar6;
  AssertionResult local_3a0;
  FloatingPoint<double> local_390;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  double val2_local;
  double val1_local;
  char *expr2_local;
  char *expr1_local;
  string local_340;
  stringstream local_320 [8];
  stringstream val2_ss;
  ostream local_310 [376];
  stringstream local_198 [8];
  stringstream val1_ss;
  ostream local_188 [376];
  long local_10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lhs.u_ = (FloatingPointUnion)val2;
  val2_local = val1;
  val1_local = (double)expr2;
  expr2_local = expr1;
  if (val2 <= val1) {
    FloatingPoint<double>::FloatingPoint(&rhs,&val2_local);
    FloatingPoint<double>::FloatingPoint(&local_390,(double *)&lhs);
    bVar1 = FloatingPoint<double>::AlmostEquals(&rhs,&local_390);
    if (bVar1) {
      AVar6 = AssertionSuccess();
      sVar5 = AVar6.message_.ptr_;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_198);
      _Var2 = std::setprecision(0x11);
      poVar3 = std::operator<<(local_188,_Var2);
      std::ostream::operator<<(poVar3,val2_local);
      std::__cxx11::stringstream::stringstream(local_320);
      _Var2 = std::setprecision(0x11);
      poVar3 = std::operator<<(local_310,_Var2);
      std::ostream::operator<<(poVar3,(double)lhs.u_);
      AssertionFailure();
      pAVar4 = AssertionResult::operator<<(&local_3a0,(char (*) [12])"Expected: (");
      pAVar4 = AssertionResult::operator<<(pAVar4,&expr2_local);
      pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [7])") <= (");
      pAVar4 = AssertionResult::operator<<(pAVar4,(char **)&val1_local);
      pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [3])0x1eabe6);
      pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [11])0x1ea54e);
      StringStreamToString(&local_340,(stringstream *)local_198);
      pAVar4 = AssertionResult::operator<<(pAVar4,&local_340);
      pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [5])" vs ");
      StringStreamToString((string *)&expr1_local,(stringstream *)local_320);
      pAVar4 = AssertionResult::operator<<
                         (pAVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&expr1_local);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar4);
      std::__cxx11::string::~string((string *)&expr1_local);
      std::__cxx11::string::~string((string *)&local_340);
      AssertionResult::~AssertionResult(&local_3a0);
      std::__cxx11::stringstream::~stringstream(local_320);
      std::__cxx11::stringstream::~stringstream(local_198);
      sVar5.ptr_ = extraout_RDX;
    }
  }
  else {
    AVar6 = AssertionSuccess();
    sVar5 = AVar6.message_.ptr_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    AVar6.message_.ptr_ = sVar5.ptr_;
    AVar6._0_8_ = this;
    return AVar6;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}